

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_swp.cpp
# Opt level: O3

int32_t anon_unknown.dwarf_3745d5::swapFormatVersion4
                  (UDataSwapper *ds,void *inData,int32_t length,void *outData,UErrorCode *errorCode)

{
  int iVar1;
  int iVar2;
  UErrorCode UVar3;
  int32_t iVar4;
  int32_t iVar5;
  int *piVar6;
  long lVar7;
  ulong uVar8;
  char *fmt;
  int32_t indexes [20];
  int32_t local_88 [5];
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c [3];
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  if (7 < (uint)length) {
    iVar4 = udata_readInt32_63(ds,*inData);
    iVar1 = iVar4 * 4;
    local_88[0] = iVar4;
    if (-1 < length && length < iVar1) {
      udata_printError_63(ds,
                          "ucol_swap(formatVersion=4): too few bytes (%d after header) for collation data\n"
                          ,(ulong)(uint)length);
      UVar3 = U_INDEX_OUTOFBOUNDS_ERROR;
      goto LAB_002eee62;
    }
    if (iVar4 < 2) {
LAB_002eec5d:
      memset(local_88 + iVar4,0xff,(ulong)(0x13 - iVar4) * 4 + 4);
      iVar2 = iVar1;
      if (5 < iVar4) {
        piVar6 = local_88 + (iVar4 - 1);
        goto LAB_002eeca4;
      }
    }
    else {
      uVar8 = 0x12;
      if ((ulong)(iVar4 - 2) < 0x12) {
        uVar8 = (ulong)(iVar4 - 2);
      }
      lVar7 = 0;
      do {
        iVar5 = udata_readInt32_63(ds,*(int32_t *)((long)inData + lVar7 * 4 + 4));
        local_88[lVar7 + 1] = iVar5;
        lVar7 = lVar7 + 1;
      } while (uVar8 + 1 != lVar7);
      if (iVar4 < 0x14) goto LAB_002eec5d;
      piVar6 = local_3c;
LAB_002eeca4:
      iVar2 = *piVar6;
    }
    if (length < 0) {
      return iVar2;
    }
    if (iVar2 <= length) {
      if (inData != outData) {
        memcpy(outData,inData,(long)iVar2);
      }
      (*ds->swapArray32)(ds,inData,iVar1,outData,errorCode);
      if (local_70 - local_74 != 0 && local_74 <= local_70) {
        (*ds->swapArray32)(ds,(void *)((long)inData + (long)local_74),local_70 - local_74,
                           (void *)((long)local_74 + (long)outData),errorCode);
      }
      if (local_68 - local_6c != 0 && local_6c <= local_68) {
        utrie2_swap_63(ds,(void *)((long)inData + (long)local_6c),local_68 - local_6c,
                       (void *)((long)local_6c + (long)outData),errorCode);
      }
      if (local_68 < local_64) {
        fmt = "ucol_swap(formatVersion=4): unknown data at IX_RESERVED8_OFFSET\n";
      }
      else {
        if (local_60 - local_64 != 0 && local_64 <= local_60) {
          (*ds->swapArray64)(ds,(void *)((long)inData + (long)local_64),local_60 - local_64,
                             (void *)((long)local_64 + (long)outData),errorCode);
        }
        if (local_60 < local_5c) {
          fmt = "ucol_swap(formatVersion=4): unknown data at IX_RESERVED10_OFFSET\n";
        }
        else {
          if (local_58 - local_5c != 0 && local_5c <= local_58) {
            (*ds->swapArray32)(ds,(void *)((long)inData + (long)local_5c),local_58 - local_5c,
                               (void *)((long)local_5c + (long)outData),errorCode);
          }
          if (local_54 - local_58 != 0 && local_58 <= local_54) {
            (*ds->swapArray32)(ds,(void *)((long)inData + (long)local_58),local_54 - local_58,
                               (void *)((long)local_58 + (long)outData),errorCode);
          }
          if (local_50 - local_54 != 0 && local_54 <= local_50) {
            (*ds->swapArray16)(ds,(void *)((long)inData + (long)local_54),local_50 - local_54,
                               (void *)((long)local_54 + (long)outData),errorCode);
          }
          if (local_4c - local_50 != 0 && local_50 <= local_4c) {
            (*ds->swapArray16)(ds,(void *)((long)inData + (long)local_50),local_4c - local_50,
                               (void *)((long)local_50 + (long)outData),errorCode);
          }
          if (local_48 - local_4c != 0 && local_4c <= local_48) {
            (*ds->swapArray16)(ds,(void *)((long)inData + (long)local_4c),local_48 - local_4c,
                               (void *)((long)local_4c + (long)outData),errorCode);
          }
          if (local_44 - local_48 != 0 && local_48 <= local_44) {
            (*ds->swapArray16)(ds,(void *)((long)inData + (long)local_48),local_44 - local_48,
                               (void *)((long)outData + (long)local_48),errorCode);
          }
          if (local_3c[0] <= local_40) {
            return iVar2;
          }
          fmt = "ucol_swap(formatVersion=4): unknown data at IX_RESERVED18_OFFSET\n";
        }
      }
      udata_printError_63(ds,fmt);
      UVar3 = U_UNSUPPORTED_ERROR;
      goto LAB_002eee62;
    }
  }
  udata_printError_63(ds,
                      "ucol_swap(formatVersion=4): too few bytes (%d after header) for collation data\n"
                      ,(ulong)(uint)length);
  UVar3 = U_INDEX_OUTOFBOUNDS_ERROR;
LAB_002eee62:
  *errorCode = UVar3;
  return 0;
}

Assistant:

int32_t
swapFormatVersion4(const UDataSwapper *ds,
                   const void *inData, int32_t length, void *outData,
                   UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }

    const uint8_t *inBytes=(const uint8_t *)inData;
    uint8_t *outBytes=(uint8_t *)outData;

    const int32_t *inIndexes=(const int32_t *)inBytes;
    int32_t indexes[IX_TOTAL_SIZE+1];

    // Need at least IX_INDEXES_LENGTH and IX_OPTIONS.
    if(0<=length && length<8) {
        udata_printError(ds, "ucol_swap(formatVersion=4): too few bytes "
                         "(%d after header) for collation data\n",
                         length);
        errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    int32_t indexesLength=indexes[0]=udata_readInt32(ds, inIndexes[0]);
    if(0<=length && length<(indexesLength*4)) {
        udata_printError(ds, "ucol_swap(formatVersion=4): too few bytes "
                         "(%d after header) for collation data\n",
                         length);
        errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    for(int32_t i=1; i<=IX_TOTAL_SIZE && i<indexesLength; ++i) {
        indexes[i]=udata_readInt32(ds, inIndexes[i]);
    }
    for(int32_t i=indexesLength; i<=IX_TOTAL_SIZE; ++i) {
        indexes[i]=-1;
    }
    inIndexes=NULL;  // Make sure we do not accidentally use these instead of indexes[].

    // Get the total length of the data.
    int32_t size;
    if(indexesLength>IX_TOTAL_SIZE) {
        size=indexes[IX_TOTAL_SIZE];
    } else if(indexesLength>IX_REORDER_CODES_OFFSET) {
        size=indexes[indexesLength-1];
    } else {
        size=indexesLength*4;
    }
    if(length<0) { return size; }

    if(length<size) {
        udata_printError(ds, "ucol_swap(formatVersion=4): too few bytes "
                         "(%d after header) for collation data\n",
                         length);
        errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    // Copy the data for inaccessible bytes and arrays of bytes.
    if(inBytes!=outBytes) {
        uprv_memcpy(outBytes, inBytes, size);
    }

    // Swap the int32_t indexes[].
    ds->swapArray32(ds, inBytes, indexesLength * 4, outBytes, &errorCode);

    // The following is a modified version of CollationDataReader::read().
    // Here we use indexes[] not inIndexes[] because
    // the inIndexes[] may not be in this machine's endianness.
    int32_t index;  // one of the indexes[] slots
    int32_t offset;  // byte offset for the index part
    // int32_t length;  // number of bytes in the index part

    index = IX_REORDER_CODES_OFFSET;
    offset = indexes[index];
    length = indexes[index + 1] - offset;
    if(length > 0) {
        ds->swapArray32(ds, inBytes + offset, length, outBytes + offset, &errorCode);
    }

    // Skip the IX_REORDER_TABLE_OFFSET byte array.

    index = IX_TRIE_OFFSET;
    offset = indexes[index];
    length = indexes[index + 1] - offset;
    if(length > 0) {
        utrie2_swap(ds, inBytes + offset, length, outBytes + offset, &errorCode);
    }

    index = IX_RESERVED8_OFFSET;
    offset = indexes[index];
    length = indexes[index + 1] - offset;
    if(length > 0) {
        udata_printError(ds, "ucol_swap(formatVersion=4): unknown data at IX_RESERVED8_OFFSET\n", length);
        errorCode = U_UNSUPPORTED_ERROR;
        return 0;
    }

    index = IX_CES_OFFSET;
    offset = indexes[index];
    length = indexes[index + 1] - offset;
    if(length > 0) {
        ds->swapArray64(ds, inBytes + offset, length, outBytes + offset, &errorCode);
    }

    index = IX_RESERVED10_OFFSET;
    offset = indexes[index];
    length = indexes[index + 1] - offset;
    if(length > 0) {
        udata_printError(ds, "ucol_swap(formatVersion=4): unknown data at IX_RESERVED10_OFFSET\n", length);
        errorCode = U_UNSUPPORTED_ERROR;
        return 0;
    }

    index = IX_CE32S_OFFSET;
    offset = indexes[index];
    length = indexes[index + 1] - offset;
    if(length > 0) {
        ds->swapArray32(ds, inBytes + offset, length, outBytes + offset, &errorCode);
    }

    index = IX_ROOT_ELEMENTS_OFFSET;
    offset = indexes[index];
    length = indexes[index + 1] - offset;
    if(length > 0) {
        ds->swapArray32(ds, inBytes + offset, length, outBytes + offset, &errorCode);
    }

    index = IX_CONTEXTS_OFFSET;
    offset = indexes[index];
    length = indexes[index + 1] - offset;
    if(length > 0) {
        ds->swapArray16(ds, inBytes + offset, length, outBytes + offset, &errorCode);
    }

    index = IX_UNSAFE_BWD_OFFSET;
    offset = indexes[index];
    length = indexes[index + 1] - offset;
    if(length > 0) {
        ds->swapArray16(ds, inBytes + offset, length, outBytes + offset, &errorCode);
    }

    index = IX_FAST_LATIN_TABLE_OFFSET;
    offset = indexes[index];
    length = indexes[index + 1] - offset;
    if(length > 0) {
        ds->swapArray16(ds, inBytes + offset, length, outBytes + offset, &errorCode);
    }

    index = IX_SCRIPTS_OFFSET;
    offset = indexes[index];
    length = indexes[index + 1] - offset;
    if(length > 0) {
        ds->swapArray16(ds, inBytes + offset, length, outBytes + offset, &errorCode);
    }

    // Skip the  IX_COMPRESSIBLE_BYTES_OFFSET byte array.

    index = IX_RESERVED18_OFFSET;
    offset = indexes[index];
    length = indexes[index + 1] - offset;
    if(length > 0) {
        udata_printError(ds, "ucol_swap(formatVersion=4): unknown data at IX_RESERVED18_OFFSET\n", length);
        errorCode = U_UNSUPPORTED_ERROR;
        return 0;
    }

    return size;
}